

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

MeanVarianceNormalizeLayerParams *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::MeanVarianceNormalizeLayerParams>(Arena *arena)

{
  MeanVarianceNormalizeLayerParams *pMVar1;
  
  if (arena != (Arena *)0x0) {
    pMVar1 = DoCreateMessage<CoreML::Specification::MeanVarianceNormalizeLayerParams>(arena);
    return pMVar1;
  }
  pMVar1 = (MeanVarianceNormalizeLayerParams *)operator_new(0x20);
  CoreML::Specification::MeanVarianceNormalizeLayerParams::MeanVarianceNormalizeLayerParams
            (pMVar1,(Arena *)0x0,false);
  return pMVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }